

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_deletelinesfor(_glist *x,t_text *text)

{
  _outconnect *oc_00;
  _outconnect *oc;
  t_linetraverser t;
  t_text *text_local;
  _glist *x_local;
  
  t._112_8_ = text;
  linetraverser_start((t_linetraverser *)&oc,x);
  while (oc_00 = linetraverser_next((t_linetraverser *)&oc), oc_00 != (_outconnect *)0x0) {
    if ((t.tr_x == (_glist *)t._112_8_) || (t._16_8_ == t._112_8_)) {
      _canvas_delete_line(x,oc_00);
      obj_disconnect(&(t.tr_x)->gl_obj,t.tr_ob._4_4_,(t_object *)t._16_8_,t.tr_inlet._4_4_);
    }
  }
  return;
}

Assistant:

void canvas_deletelinesfor(t_canvas *x, t_text *text)
{
    t_linetraverser t;
    t_outconnect *oc;
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (t.tr_ob == text || t.tr_ob2 == text)
        {
            _canvas_delete_line(x, oc);
            obj_disconnect(t.tr_ob, t.tr_outno, t.tr_ob2, t.tr_inno);
        }
    }
}